

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O3

bool PKCS12CreateVector(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,EVP_PKEY *pkey,
                       vector<x509_st_*,_std::allocator<x509_st_*>_> *certs)

{
  pointer ppxVar1;
  X509 *x;
  UniquePtr<struct_stack_st_X509> sk;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  pointer ppxVar5;
  bool bVar6;
  _Head_base<0UL,_x509_st_*,_false> local_58;
  UniquePtr<struct_stack_st_X509> chain;
  UniquePtr<PKCS12> p12;
  uint8_t *ptr;
  
  chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)OPENSSL_sk_new_null();
  if ((tuple<stack_st_X509_*,_bssl::internal::Deleter>)
      chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
LAB_003480af:
    bVar6 = false;
  }
  else {
    ppxVar1 = (certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    sk._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
         chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
    for (ppxVar5 = (certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
             sk._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl, ppxVar5 != ppxVar1;
        ppxVar5 = ppxVar5 + 1) {
      x = *ppxVar5;
      if (x != (X509 *)0x0) {
        X509_up_ref(x);
      }
      local_58._M_head_impl = x;
      sVar4 = OPENSSL_sk_push((OPENSSL_STACK *)
                              sk._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,x);
      if (sVar4 == 0) {
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_58);
        goto LAB_003480af;
      }
      local_58._M_head_impl = (X509 *)0x0;
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_58);
      sk = chain;
    }
    p12._M_t.super___uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<pkcs12_st,_bssl::internal::Deleter,_true,_true>)
         PKCS12_create("foo",(char *)0x0,(EVP_PKEY *)pkey,(X509 *)0x0,
                       (stack_st_X509 *)
                       sk._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,0,0,0,0,0);
    if (((tuple<pkcs12_st_*,_bssl::internal::Deleter>)
         p12._M_t.super___uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl ==
         (_Head_base<0UL,_pkcs12_st_*,_false>)0x0) ||
       (uVar2 = i2d_PKCS12((PKCS12 *)
                           p12._M_t.super___uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl,(uchar **)0x0),
       (int)uVar2 < 0)) {
      bVar6 = false;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,(ulong)uVar2);
      ptr = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
      uVar3 = i2d_PKCS12((PKCS12 *)
                         p12._M_t.super___uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl,&ptr);
      bVar6 = uVar3 == uVar2;
    }
    std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::~unique_ptr(&p12);
  }
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&chain);
  return bVar6;
}

Assistant:

static bool PKCS12CreateVector(std::vector<uint8_t> *out, EVP_PKEY *pkey,
                               const std::vector<X509 *> &certs) {
  bssl::UniquePtr<STACK_OF(X509)> chain(sk_X509_new_null());
  if (!chain) {
    return false;
  }

  for (X509 *cert : certs) {
    if (!bssl::PushToStack(chain.get(), bssl::UpRef(cert))) {
      return false;
    }
  }

  bssl::UniquePtr<PKCS12> p12(PKCS12_create(kPassword, nullptr /* name */, pkey,
                                            nullptr /* cert */, chain.get(), 0,
                                            0, 0, 0, 0));
  if (!p12) {
    return false;
  }

  int len = i2d_PKCS12(p12.get(), nullptr);
  if (len < 0) {
    return false;
  }
  out->resize(static_cast<size_t>(len));
  uint8_t *ptr = out->data();
  return i2d_PKCS12(p12.get(), &ptr) == len;
}